

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_15::JUnitReporter::test_case_exception
          (JUnitReporter *this,TestCaseException *e)

{
  char *__s;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> DOCTEST_ANON_LOCK_6;
  TestCaseException *e_local;
  JUnitReporter *this_local;
  
  DOCTEST_ANON_LOCK_6._M_device = (mutex_type *)e;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"exception",&local_41);
  __s = String::c_str((String *)DOCTEST_ANON_LOCK_6._M_device);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,__s,&local_79);
  JUnitTestCaseData::addError(&this->testCaseData,&local_40,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void test_case_exception(const TestCaseException& e) override {
            DOCTEST_LOCK_MUTEX(mutex)
            testCaseData.addError("exception", e.error_string.c_str());
        }